

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O3

errno_t __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::AppendUint64
          (StringBuilder<Memory::ArenaAllocator> *this,unsigned_long value)

{
  code *pcVar1;
  bool bVar2;
  errno_t eVar3;
  undefined4 *puVar4;
  char16 *pcVar5;
  char16 local_58;
  char16 local_56 [3];
  WCHAR buf [21];
  
  eVar3 = _ui64tow_s(value,(char16_t_conflict *)&local_58,0x15,10);
  if (eVar3 == 0) {
    if (local_58 != L'\0') {
      pcVar5 = local_56;
      do {
        Append(this,local_58);
        local_58 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (local_58 != L'\0');
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x175,"(result==0)","Failed to translate value to string");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return eVar3;
}

Assistant:

errno_t AppendUint64(unsigned __int64 value)
        {
            const int max_length = 20; // maximum length of 64-bit value converted to base 10 string
            const int radix = 10;
            WCHAR buf[max_length+1];
            errno_t result = _ui64tow_s(value, buf, max_length+1, radix);
            AssertMsg(result==0, "Failed to translate value to string");
            if (result == 0)
            {
                AppendSz(buf);
            }
            return result;
        }